

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbasematrix.h
# Opt level: O3

bool __thiscall
TPZMatrix<std::complex<long_double>_>::CompareValues
          (TPZMatrix<std::complex<long_double>_> *this,TPZMatrix<std::complex<long_double>_> *M,
          complex<long_double> tol)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble lVar6;
  longdouble in_ST2;
  longdouble lVar7;
  longdouble in_ST3;
  longdouble in_ST4;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined2 uStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined2 uStack_a0;
  long local_98;
  double local_90;
  double local_88;
  unkbyte10 local_7c;
  unkbyte10 local_70;
  longdouble local_64;
  longdouble local_58;
  longdouble local_48;
  
  local_98 = (this->super_TPZBaseMatrix).fRow;
  bVar2 = false;
  if ((((M->super_TPZBaseMatrix).fRow == local_98) &&
      (lVar1 = (this->super_TPZBaseMatrix).fCol, bVar2 = false,
      (M->super_TPZBaseMatrix).fCol == lVar1)) && (bVar2 = true, 0 < local_98)) {
    local_70 = tol._M_value._0_10_;
    local_7c = tol._M_value._16_10_;
    lVar4 = 0;
    do {
      if (0 < lVar1) {
        lVar3 = 0;
        lVar5 = in_ST1;
        do {
          in_ST1 = in_ST3;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_b8,this,lVar4,lVar3);
          (*(M->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_58,M,lVar4,lVar3);
          lVar7 = (longdouble)CONCAT28(uStack_b0,CONCAT44(uStack_b4,local_b8)) - local_58;
          lVar6 = (longdouble)CONCAT28(uStack_a0,CONCAT44(uStack_a4,local_a8)) - local_48;
          local_b8 = SUB104(lVar7,0);
          uStack_b4 = (undefined4)((unkuint10)lVar7 >> 0x20);
          uStack_b0 = (undefined2)((unkuint10)lVar7 >> 0x40);
          local_a8 = SUB104(lVar6,0);
          uStack_a4 = (undefined4)((unkuint10)lVar6 >> 0x20);
          uStack_a0 = (undefined2)((unkuint10)lVar6 >> 0x40);
          in_ST3 = in_ST4;
          lVar6 = in_ST4;
          cabsl();
          local_88 = (double)in_ST0;
          local_90 = ABS(local_88);
          local_64 = (longdouble)local_90;
          local_b8 = (undefined4)local_70;
          uStack_b4 = SUB104(local_70,4);
          uStack_b0 = SUB102(local_70,8);
          local_a8 = (undefined4)local_7c;
          uStack_a4 = SUB104(local_7c,4);
          uStack_a0 = SUB102(local_7c,8);
          in_ST0 = in_ST2;
          in_ST2 = in_ST4;
          in_ST4 = lVar6;
          cabsl();
          if (ABS(lVar5) < local_64) {
            return false;
          }
          lVar3 = lVar3 + 1;
          lVar5 = in_ST1;
        } while (lVar1 != lVar3);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != local_98);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline int64_t Rows() const { return fRow; }